

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGTemp * tcg_global_mem_new_internal_mipsel
                    (TCGContext_conflict4 *s,TCGType_conflict type,TCGv_ptr base,intptr_t offset,
                    char *name)

{
  int iVar1;
  TCGTemp *pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0x2000000000;
  iVar1 = s->nb_temps;
  s->nb_globals = iVar1 + 1;
  s->nb_temps = iVar1 + 1;
  pTVar2 = s->temps + iVar1;
  s->temps[iVar1].state = 0;
  s->temps[iVar1].state_ptr = (void *)0x0;
  s->temps[iVar1].mem_offset = 0;
  s->temps[iVar1].name = (char *)0x0;
  s->temps[iVar1].val = 0;
  s->temps[iVar1].mem_base = (TCGTemp *)0x0;
  *(undefined8 *)pTVar2 = 0x2000000000;
  if ((*(ulong *)(base + (long)&s->pool_cur) >> 0x20 & 1) == 0) {
    *(ulong *)(base + (long)&s->pool_cur) = *(ulong *)(base + (long)&s->pool_cur) | 0x400000000;
    s->nb_indirects = s->nb_indirects + 1;
    uVar3 = 0x200000000;
    uVar4 = *(ulong *)pTVar2 & 0xffffffed0000ffff;
  }
  else {
    uVar3 = 0;
  }
  *(ulong *)pTVar2 = type << 0x18 | uVar4 | (ulong)((type & 0xff) << 0x10) | uVar3 | 0x1000000000;
  s->temps[iVar1].mem_base = (TCGTemp *)(base + (long)&s->pool_cur);
  s->temps[iVar1].mem_offset = offset;
  s->temps[iVar1].name = name;
  return pTVar2;
}

Assistant:

TCGTemp *tcg_global_mem_new_internal(TCGContext *s, TCGType type, TCGv_ptr base,
                                     intptr_t offset, const char *name)
{
    TCGTemp *base_ts = tcgv_ptr_temp(s, base);
    TCGTemp *ts = tcg_global_alloc(s);
    int indirect_reg = 0, bigendian = 0;
#ifdef HOST_WORDS_BIGENDIAN
    bigendian = 1;
#endif

    if (!base_ts->fixed_reg) {
        /* We do not support double-indirect registers.  */
        tcg_debug_assert(!base_ts->indirect_reg);
        base_ts->indirect_base = 1;
        s->nb_indirects += (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64
                            ? 2 : 1);
        indirect_reg = 1;
    }

    if (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64) {
        TCGTemp *ts2 = tcg_global_alloc(s);
        char buf[64];

        ts->base_type = TCG_TYPE_I64;
        ts->type = TCG_TYPE_I32;
        ts->indirect_reg = indirect_reg;
        ts->mem_allocated = 1;
        ts->mem_base = base_ts;
        ts->mem_offset = offset + bigendian * 4;
        pstrcpy(buf, sizeof(buf), name);
        pstrcat(buf, sizeof(buf), "_0");
        ts->name = g_strdup(buf);

        tcg_debug_assert(ts2 == ts + 1);
        ts2->base_type = TCG_TYPE_I64;
        ts2->type = TCG_TYPE_I32;
        ts2->indirect_reg = indirect_reg;
        ts2->mem_allocated = 1;
        ts2->mem_base = base_ts;
        ts2->mem_offset = offset + (1 - bigendian) * 4;
        pstrcpy(buf, sizeof(buf), name);
        pstrcat(buf, sizeof(buf), "_1");
        ts2->name = g_strdup(buf);
    } else {
        ts->base_type = type;
        ts->type = type;
        ts->indirect_reg = indirect_reg;
        ts->mem_allocated = 1;
        ts->mem_base = base_ts;
        ts->mem_offset = offset;
        ts->name = name;
    }
    return ts;
}